

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<1u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  code *pcVar1;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_00;
  bool bVar2;
  Char CVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar12;
  uint k;
  Type local_84;
  Char *pCStack_80;
  int lastOcc_1;
  int *local_78;
  undefined4 *local_70;
  ulong local_68;
  uint *local_60;
  uint local_54;
  ulong local_50;
  TextbookBoyerMoore<char16_t> *local_48;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *local_40;
  int local_38;
  uint local_34;
  int lastOcc;
  int iVar11;
  
  pCStack_80 = pat;
  local_48 = this;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar2) goto LAB_00f063ba;
    *puVar6 = 0;
  }
  if (inputLength < *inputOffset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar2) {
LAB_00f063ba:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (patLen <= inputLength) {
    uVar10 = *inputOffset;
    uVar8 = patLen - 1;
    local_34 = inputLength - uVar8;
    if (uVar10 < local_34) {
      local_78 = (local_48->goodSuffix).ptr;
      local_40 = &local_48->lastOccurrence;
      local_60 = inputOffset;
      local_70 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_54 = patLen - 2;
      local_68 = (ulong)patLen;
      local_50 = (ulong)uVar8;
      do {
        CVar3 = input[uVar10 + uVar8];
        uVar12 = local_50;
        if (pCStack_80[local_50] != CVar3) {
          do {
            this_00 = local_40;
            if ((ushort)CVar3 < 0x100) {
              BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (local_40,(uint)(ushort)CVar3);
              if (BVar4 == 0) {
                uVar10 = uVar10 + (int)local_68;
                uVar12 = local_50;
                if (local_34 <= uVar10) {
                  return false;
                }
              }
              else {
                local_38 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                     (this_00,(uint)(ushort)CVar3);
                uVar12 = local_50;
LAB_00f0623e:
                puVar6 = local_70;
                iVar5 = uVar8 - local_38;
                if (iVar5 < local_78[uVar12]) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar6 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                     ,0xeb,
                                     "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                     ,
                                     "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                    );
                  if (!bVar2) goto LAB_00f063ba;
                  *puVar6 = 0;
                  iVar5 = uVar8 - local_38;
                }
                uVar10 = iVar5 + uVar10;
                if (local_34 <= uVar10) {
                  return false;
                }
              }
            }
            else {
              bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (local_40,(uint)(ushort)CVar3,&local_38);
              if (bVar2) goto LAB_00f0623e;
              uVar10 = uVar10 + (int)local_68;
              if (local_34 <= uVar10) {
                return false;
              }
            }
            CVar3 = input[uVar10 + uVar8];
          } while (pCStack_80[uVar12] != CVar3);
        }
        uVar9 = local_54;
        if (uVar8 == 0) {
LAB_00f063af:
          *local_60 = uVar10;
          return true;
        }
        while( true ) {
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          if (pCStack_80[uVar9] != input[uVar10 + uVar9]) break;
          uVar9 = uVar9 - 1;
          if ((int)uVar9 < 0) goto LAB_00f063af;
        }
        k = (uint)(ushort)input[uVar10 + uVar9];
        if (k < 0x100) {
          BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap(local_40,k);
          if (BVar4 == 0) {
            iVar5 = (local_48->lastOccurrence).defv;
          }
          else {
            iVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap(local_40,k)
            ;
          }
        }
        else {
          bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (local_40,k,&local_84);
          pTVar7 = &(local_48->lastOccurrence).defv;
          if (bVar2) {
            pTVar7 = &local_84;
          }
          iVar5 = *pTVar7;
        }
        iVar11 = uVar9 - iVar5;
        if ((int)(uVar9 - iVar5) <= local_78[(int)uVar9]) {
          iVar11 = local_78[(int)uVar9];
        }
        uVar10 = iVar11 + uVar10;
        if (local_34 <= uVar10) {
          return false;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }